

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::spf1
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int subtreeRootNode1,TreeIndexAPTED *t2,int subtreeRootNode2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  double dVar6;
  double dVar7;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *pAVar8;
  double dVar9;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *local_100;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *local_e8;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *local_d0;
  int local_b4;
  int label1_2;
  int i_1;
  double nodeRenMinusDel;
  double minRenMinusDel;
  double maxCost_2;
  double cost_1;
  int label2_2;
  int label2_1;
  int i;
  double nodeRenMinusIns;
  double minRenMinusIns;
  double maxCost_1;
  double cost;
  int label1_1;
  double renCost;
  double maxCost;
  int label2;
  int label1;
  int subtreeSize2;
  int subtreeSize1;
  int subtreeRootNode2_local;
  TreeIndexAPTED *t2_local;
  int subtreeRootNode1_local;
  TreeIndexAPTED *t1_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PreLToSize).prel_to_size_,(long)subtreeRootNode1);
  iVar1 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PreLToSize).prel_to_size_,(long)subtreeRootNode2);
  iVar2 = *pvVar4;
  if ((iVar1 == 1) && (iVar2 == 1)) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t1->super_PreLToLabelId).prel_to_label_id_,(long)subtreeRootNode1);
    iVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2->super_PreLToLabelId).prel_to_label_id_,(long)subtreeRootNode2);
    iVar2 = *pvVar4;
    dVar6 = cost_model::UnitCostModelLD<label::StringLabel>::del
                      ((this->
                       super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                       ).c_,iVar1);
    dVar7 = cost_model::UnitCostModelLD<label::StringLabel>::ins
                      ((this->
                       super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                       ).c_,iVar2);
    local_d0 = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                *)(dVar6 + dVar7);
    pAVar8 = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
              *)cost_model::UnitCostModelLD<label::StringLabel>::ren
                          ((this->
                           super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                           ).c_,iVar1,iVar2);
    if ((double)pAVar8 < (double)local_d0) {
      local_d0 = pAVar8;
    }
    this_local = local_d0;
  }
  else if (iVar1 == 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t1->super_PreLToLabelId).prel_to_label_id_,(long)subtreeRootNode1);
    iVar1 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(t2->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_,
                        (long)subtreeRootNode2);
    dVar6 = *pvVar5;
    dVar7 = cost_model::UnitCostModelLD<label::StringLabel>::del
                      ((this->
                       super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                       ).c_,iVar1);
    local_e8 = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                *)(dVar6 + dVar7);
    nodeRenMinusIns = dVar6;
    for (label2_2 = subtreeRootNode2; label2_2 < subtreeRootNode2 + iVar2; label2_2 = label2_2 + 1)
    {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2->super_PreLToLabelId).prel_to_label_id_,(long)label2_2);
      iVar3 = *pvVar4;
      dVar7 = cost_model::UnitCostModelLD<label::StringLabel>::ren
                        ((this->
                         super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                         ).c_,iVar1,iVar3);
      dVar9 = cost_model::UnitCostModelLD<label::StringLabel>::ins
                        ((this->
                         super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                         ).c_,iVar3);
      if (dVar7 - dVar9 < nodeRenMinusIns) {
        nodeRenMinusIns = dVar7 - dVar9;
      }
    }
    if (nodeRenMinusIns + dVar6 < (double)local_e8) {
      local_e8 = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                  *)(nodeRenMinusIns + dVar6);
    }
    this_local = local_e8;
  }
  else if (iVar2 == 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2->super_PreLToLabelId).prel_to_label_id_,(long)subtreeRootNode2);
    iVar2 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(t1->super_PreLToSubtreeCost).prel_to_subtree_del_cost_,
                        (long)subtreeRootNode1);
    dVar6 = *pvVar5;
    dVar7 = cost_model::UnitCostModelLD<label::StringLabel>::ins
                      ((this->
                       super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                       ).c_,iVar2);
    local_100 = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 *)(dVar6 + dVar7);
    nodeRenMinusDel = dVar6;
    for (local_b4 = subtreeRootNode1; local_b4 < subtreeRootNode1 + iVar1; local_b4 = local_b4 + 1)
    {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t1->super_PreLToLabelId).prel_to_label_id_,(long)local_b4);
      iVar3 = *pvVar4;
      dVar7 = cost_model::UnitCostModelLD<label::StringLabel>::ren
                        ((this->
                         super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                         ).c_,iVar3,iVar2);
      dVar9 = cost_model::UnitCostModelLD<label::StringLabel>::del
                        ((this->
                         super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                         ).c_,iVar3);
      if (dVar7 - dVar9 < nodeRenMinusDel) {
        nodeRenMinusDel = dVar7 - dVar9;
      }
    }
    if (nodeRenMinusDel + dVar6 < (double)local_100) {
      local_100 = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                   *)(nodeRenMinusDel + dVar6);
    }
    this_local = local_100;
  }
  else {
    this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                  *)0xbff0000000000000;
  }
  return (double)this_local;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::spf1(const TreeIndex& t1,
    int subtreeRootNode1, const TreeIndex& t2, int subtreeRootNode2) {
  int subtreeSize1 = t1.prel_to_size_[subtreeRootNode1];
  int subtreeSize2 = t2.prel_to_size_[subtreeRootNode2];
  if (subtreeSize1 == 1 && subtreeSize2 == 1) {
    int label1 = t1.prel_to_label_id_[subtreeRootNode1];
    int label2 = t2.prel_to_label_id_[subtreeRootNode2];
    double maxCost = c_.del(label1) + c_.ins(label2);
    double renCost = c_.ren(label1, label2);
    // std::cout << "spf1 = " << (renCost < maxCost ? renCost : maxCost) << std::endl;
    return renCost < maxCost ? renCost : maxCost;
  }
  if (subtreeSize1 == 1) {
    int label1 = t1.prel_to_label_id_[subtreeRootNode1];
    double cost = t2.prel_to_subtree_ins_cost_[subtreeRootNode2];
    double maxCost = cost + c_.del(label1);
    double minRenMinusIns = cost;
    double nodeRenMinusIns = 0;
    for (int i = subtreeRootNode2; i < subtreeRootNode2 + subtreeSize2; ++i) {
      int label2 = t2.prel_to_label_id_[i];
      nodeRenMinusIns = c_.ren(label1, label2) - c_.ins(label2);
      if (nodeRenMinusIns < minRenMinusIns) {
        minRenMinusIns = nodeRenMinusIns;
      }
    }
    cost += minRenMinusIns;
    // std::cout << "spf1 = " << (cost < maxCost ? cost : maxCost) << std::endl;
    return cost < maxCost ? cost : maxCost;
  }
  if (subtreeSize2 == 1) {
    int label2 = t2.prel_to_label_id_[subtreeRootNode2];
    double cost = t1.prel_to_subtree_del_cost_[subtreeRootNode1];
    double maxCost = cost + c_.ins(label2);
    double minRenMinusDel = cost;
    double nodeRenMinusDel = 0;
    for (int i = subtreeRootNode1; i < subtreeRootNode1 + subtreeSize1; ++i) {
      int label1 = t1.prel_to_label_id_[i];
      nodeRenMinusDel = c_.ren(label1, label2) - c_.del(label1);
      if (nodeRenMinusDel < minRenMinusDel) {
        minRenMinusDel = nodeRenMinusDel;
      }
    }
    cost += minRenMinusDel;
    // std::cout << "spf1 = " << (cost < maxCost ? cost : maxCost) << std::endl;
    return cost < maxCost ? cost : maxCost;
  }
  // std::cout << "spf1 = -1" << std::endl;
  return -1;
}